

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_compute_num_workers_for_mt(AV1_COMP *cpi)

{
  int iVar1;
  long *in_RDI;
  int i;
  MULTI_THREADED_MODULES in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 0xc; iVar2 = iVar2 + 1) {
    iVar1 = compute_num_mod_workers
                      ((AV1_COMP *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffec);
    *(int *)(*in_RDI + 0x123d4 + (long)iVar2 * 4) = iVar1;
  }
  return;
}

Assistant:

void av1_compute_num_workers_for_mt(AV1_COMP *cpi) {
  for (int i = MOD_FP; i < NUM_MT_MODULES; i++) {
    cpi->ppi->p_mt_info.num_mod_workers[i] =
        compute_num_mod_workers(cpi, (MULTI_THREADED_MODULES)i);
  }
}